

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O3

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  int iVar1;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar2;
  Iterator *pIVar3;
  size_type __len2;
  Snapshot *__len2_00;
  char *__tmp;
  Rep *pRVar4;
  Rep *pRVar5;
  long in_FS_OFFSET;
  Slice key;
  WritableFile *file;
  string fname;
  void *local_88;
  Slice local_80;
  char *local_70;
  Snapshot *pSStack_68;
  WritableFile *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0;
  meta->file_size = 0;
  (*iter->_vptr_Iterator[3])(iter);
  TableFileName(&local_58,dbname,meta->number);
  iVar1 = (*iter->_vptr_Iterator[2])(iter);
  if ((char)iVar1 == '\0') {
    pRVar4 = (Rep *)0x0;
  }
  else {
    (*env->_vptr_Env[4])(&local_70,env,&local_58,&local_60);
    *(char **)this = local_70;
    if ((Rep *)local_70 != (Rep *)0x0) goto LAB_00d30f26;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,local_60);
    iVar1 = (*iter->_vptr_Iterator[8])(iter);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&(meta->smallest).rep_,0,(meta->smallest).rep_._M_string_length,
               (char *)CONCAT44(extraout_var,iVar1),__len2);
    while (iVar1 = (*iter->_vptr_Iterator[2])(iter), (char)iVar1 != '\0') {
      iVar1 = (*iter->_vptr_Iterator[8])(iter);
      local_70 = (char *)CONCAT44(extraout_var_00,iVar1);
      pSStack_68 = __len2_00;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&(meta->largest).rep_,0,(meta->largest).rep_._M_string_length,local_70,
                 (size_type)__len2_00);
      iVar1 = (*iter->_vptr_Iterator[9])(iter);
      local_80.data_ = (char *)CONCAT44(extraout_var_01,iVar1);
      TableBuilder::Add(this_00,(Slice *)&local_70,&local_80);
      (*iter->_vptr_Iterator[6])(iter);
    }
    TableBuilder::Finish((TableBuilder *)&local_70);
    pRVar4 = (Rep *)local_70;
    pRVar5 = *(Rep **)this;
    *(char **)this = local_70;
    local_70 = (char *)pRVar5;
    if (pRVar5 != (Rep *)0x0) {
      operator_delete__(pRVar5);
    }
    if (pRVar4 == (Rep *)0x0) {
      uVar2 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar2;
      if (uVar2 == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00,8);
      (*local_60->_vptr_WritableFile[5])(&local_70);
      *(char **)this = local_70;
      pRVar4 = (Rep *)local_70;
      if ((Rep *)local_70 == (Rep *)0x0) {
        (*local_60->_vptr_WritableFile[3])(&local_70);
        *(char **)this = local_70;
        pRVar4 = (Rep *)local_70;
      }
    }
    else {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00,8);
    }
    if (local_60 != (WritableFile *)0x0) {
      (*local_60->_vptr_WritableFile[1])();
    }
    local_60 = (WritableFile *)0x0;
    if (pRVar4 == (Rep *)0x0) {
      pSStack_68 = (Snapshot *)0x0;
      local_70 = (char *)0x100;
      pIVar3 = TableCache::NewIterator
                         (table_cache,(ReadOptions *)&local_70,meta->number,meta->file_size,
                          (Table **)0x0);
      (*pIVar3->_vptr_Iterator[10])(&local_70,pIVar3);
      pRVar4 = (Rep *)local_70;
      *(char **)this = local_70;
      (*pIVar3->_vptr_Iterator[1])(pIVar3);
    }
  }
  (*iter->_vptr_Iterator[10])(&local_70,iter);
  pRVar5 = pRVar4;
  if ((Rep *)local_70 != (Rep *)0x0) {
    operator_delete__(local_70);
    (*iter->_vptr_Iterator[10])(&local_70,iter);
    *(char **)this = local_70;
    pRVar5 = (Rep *)local_70;
    local_70 = (char *)pRVar4;
    if (pRVar4 != (Rep *)0x0) {
      operator_delete__(pRVar4);
      pRVar5 = *(Rep **)this;
    }
  }
  if (((pRVar5 != (Rep *)0x0) || (meta->file_size == 0)) &&
     ((*env->_vptr_Env[8])(&local_88,env,&local_58), local_88 != (void *)0x0)) {
    operator_delete__(local_88);
  }
LAB_00d30f26:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->DeleteFile(fname);
  }
  return s;
}